

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void google::protobuf::internal::MapFieldBase::UnsafeShallowSwapImpl
               (MapFieldBase *lhs,MapFieldBase *rhs)

{
  TaggedPtr TVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  ReflectionPayload *pRVar4;
  
  pAVar2 = arena(lhs);
  pAVar3 = arena(rhs);
  if (pAVar2 != pAVar3) {
    UnsafeShallowSwapImpl();
    TVar1 = (pAVar2->impl_).alloc_policy_.policy_;
    if (((TVar1 & 1) != 0) && (pRVar4 = ToPayload(TVar1), pRVar4 != (ReflectionPayload *)0x0)) {
      absl::lts_20240722::Mutex::Lock();
      (**(code **)((pAVar2->impl_).tag_and_id_ + 0x48))(pAVar2);
      absl::lts_20240722::Mutex::Unlock();
    }
    return;
  }
  TVar1 = (rhs->payload_)._M_i;
  (rhs->payload_)._M_i = (lhs->payload_)._M_i;
  (lhs->payload_)._M_i = TVar1;
  return;
}

Assistant:

void MapFieldBase::UnsafeShallowSwapImpl(MapFieldBase& lhs, MapFieldBase& rhs) {
  ABSL_DCHECK_EQ(lhs.arena(), rhs.arena());
  lhs.InternalSwap(&rhs);
}